

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_dense.hpp
# Opt level: O2

type * Disa::operator+(type *__return_storage_ptr__,Vector_Dense<double,_3UL> *vector0,
                      Vector_Dense<double,_2UL> *vector1)

{
  ostream *poVar1;
  source_location *in_RCX;
  string sStack_f8;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  undefined **local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  poVar1 = std::operator<<((ostream *)&std::cerr,"\n");
  local_38 = &PTR_s__workspace_llm4binary_github_lic_00154838;
  console_format_abi_cxx11_(&local_30,(Disa *)0x0,(Log_Level)&local_38,in_RCX);
  poVar1 = std::operator<<(poVar1,(string *)&local_30);
  std::__cxx11::to_string(&local_d8,3);
  std::operator+(&local_b8,"Incompatible vector sizes, ",&local_d8);
  std::operator+(&local_98,&local_b8," vs. ");
  std::__cxx11::to_string(&sStack_f8,2);
  std::operator+(&local_78,&local_98,&sStack_f8);
  std::operator+(&local_58,&local_78,".");
  poVar1 = std::operator<<(poVar1,(string *)&local_58);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&sStack_f8);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_30);
  exit(1);
}

Assistant:

typename Static_Promoter<Vector_Dense<_type, _size_0>, Vector_Dense<_type, _size_1>>::type constexpr operator+(
const Vector_Dense<_type, _size_0>& vector0, const Vector_Dense<_type, _size_1>& vector1) {
  ASSERT_DEBUG(vector0.size() == vector1.size(), "Incompatible vector sizes, " + std::to_string(vector0.size()) +
                                                 " vs. " + std::to_string(vector1.size()) + ".");
  typedef typename Static_Promoter<Vector_Dense<_type, _size_0>, Vector_Dense<_type, _size_1>>::type _return_vector;
  return _return_vector([&](const std::size_t ii) { return vector0[ii] + vector1[ii]; }, vector0.size());
}